

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

Node * __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getNode
          (HttpRouter<uWS::HttpContextData<false>::RouterData> *this,Node *parent,string *child,
          bool isHighPriority)

{
  pointer puVar1;
  Node *pNVar2;
  __type _Var3;
  __uniq_ptr_data<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>,_true,_true>
  this_00;
  __normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_*,_std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>_>
  __position;
  iterator iVar4;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  *node;
  pointer puVar5;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]incppect_third_party_uWebSockets_src_HttpRouter_h:77:117)>
  __comp;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
  newNode;
  
  puVar5 = (parent->children).
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (parent->children).
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      this_00.
      super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
      ._M_t.
      super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
      .
      super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
            )operator_new(0x58);
      std::__cxx11::string::string
                ((string *)
                 this_00.
                 super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                 .
                 super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                 ._M_head_impl,(string *)child);
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x40) = 0;
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x48) = 0;
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x30) = 0;
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x38) = 0;
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x20) = 0;
      *(undefined8 *)
       ((long)this_00.
              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
              .
              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
              ._M_head_impl + 0x28) = 0;
      *(bool *)((long)this_00.
                      super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                      .
                      super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                      ._M_head_impl + 0x50) = isHighPriority;
      __comp._M_comp.this = (HttpRouter<uWS::HttpContextData<true>::RouterData> *)this;
      __comp._M_comp.parent = (Node *)parent;
      newNode._M_t.
      super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
      ._M_t.
      super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
      .
      super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>,_true,_true>
            )(__uniq_ptr_data<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               .
               super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
               ._M_head_impl;
      __position = std::
                   __upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>*,std::vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>,std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>>>>,std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>>,__gnu_cxx::__ops::_Val_comp_iter<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getNode(uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node*,std::__cxx11::string,bool)::_lambda(auto:1&,auto:2&)_1_>>
                             ((parent->children).
                              super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (parent->children).
                              super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&newNode,__comp);
      iVar4 = std::
              vector<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
              ::_M_insert_rval(&parent->children,(const_iterator)__position._M_current,&newNode);
      pNVar2 = ((iVar4._M_current)->_M_t).
               super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
               .
               super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
               ._M_head_impl;
      std::
      unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
      ::~unique_ptr(&newNode);
      return pNVar2;
    }
    _Var3 = std::operator==(&((puVar5->_M_t).
                              super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                              .
                              super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                             ._M_head_impl)->name,child);
    if ((_Var3) &&
       (pNVar2 = (puVar5->_M_t).
                 super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>
                 .
                 super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node_*,_false>
                 ._M_head_impl, pNVar2->isHighPriority == isHighPriority)) break;
    puVar5 = puVar5 + 1;
  }
  return pNVar2;
}

Assistant:

Node *getNode(Node *parent, std::string child, bool isHighPriority) {
        for (std::unique_ptr<Node> &node : parent->children) {
            if (node->name == child && node->isHighPriority == isHighPriority) {
                return node.get();
            }
        }

        /* Insert sorted, but keep order if parent is root (we sort methods by priority elsewhere) */
        std::unique_ptr<Node> newNode(new Node({child}));
        newNode->isHighPriority = isHighPriority;
        return parent->children.emplace(std::upper_bound(parent->children.begin(), parent->children.end(), newNode, [parent, this](auto &a, auto &b) {

            if (a->isHighPriority != b->isHighPriority) {
                return a->isHighPriority;
            }

            return b->name.length() && (parent != &root) && (b->name < a->name);
        }), std::move(newNode))->get();
    }